

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * MyGame_Example_notemptyenum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if ((char)(uVar1 >> 0x38) == 'x') {
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,1,aggregate);
    if (pcVar2 != buf) {
      *value = 0;
      *value_sign = 0;
      buf = pcVar2;
    }
  }
  return buf;
}

Assistant:

static const char *MyGame_Example_notemptyenum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if ((w & 0xff00000000000000) == 0x7800000000000000) { /* "x" */
        buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 1, aggregate);
        if (buf != mark) {
            *value = UINT64_C(0), *value_sign = 0;
        } else {
            return unmatched;
        }
    } else { /* "x" */
        return unmatched;
    } /* "x" */
    return buf;
}